

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O0

decode_result
jessilib::decode_codepoint<char>(basic_string_view<char,_std::char_traits<char>_> in_string)

{
  char *in_RDX;
  decode_result dVar1;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_local;
  
  in_string_00._M_len = in_string._M_str;
  in_string_00._M_str = in_RDX;
  dVar1 = decode_codepoint_utf8<char>((jessilib *)in_string._M_len,in_string_00);
  dVar1._4_4_ = 0;
  return dVar1;
}

Assistant:

constexpr decode_result decode_codepoint(std::basic_string_view<CharT> in_string) {
	if constexpr (std::is_same_v<CharT, char8_t>) {
		return decode_codepoint_utf8(in_string);
	}
	else if constexpr (std::is_same_v<CharT, char16_t>) {
		return decode_codepoint_utf16(in_string);
	}
	else if constexpr (std::is_same_v<CharT, char32_t>) {
		return decode_codepoint_utf32(in_string);
	}
	else if constexpr (std::is_same_v<CharT, wchar_t>) {
		if constexpr (std::is_same_v<unicode_traits<wchar_t>::equivalent_type, char16_t>) {
			return decode_codepoint_utf16<wchar_t>(in_string);
		}
		else if constexpr (std::is_same_v<unicode_traits<wchar_t>::equivalent_type, char32_t>) {
			return decode_codepoint_utf32<wchar_t>(in_string);
		}
	}
#ifdef JESSILIB_CHAR_AS_UTF8
	else if constexpr (std::is_same_v<CharT, char>) {
		return decode_codepoint_utf8(in_string);
	}
#endif // JESSILIB_CHAR_AS_UTF8
}